

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTreeWalker.cpp
# Opt level: O0

GdlGlyphClassDefn * __thiscall
GrcManager::ConvertClassToIntersection
          (GrcManager *this,Symbol psymClass,GdlGlyphClassDefn *pglfc,GrpLineAndFile *lnf)

{
  GdlGlyphClassDefn *pglfc_00;
  GdlGlyphIntersectionClassDefn *this_00;
  Symbol pglfd;
  GdlRenderer *in_RDX;
  GrcSymbolTableEntry *in_RSI;
  GrcManager *in_RDI;
  string staAnonClassName;
  Symbol psymAnonClass;
  string staName;
  GdlGlyphIntersectionClassDefn *pglfciNew;
  GdlGlyphIntersectionClassDefn *pglfci;
  GdlGlyphClassDefn *pglfcRet;
  GdlGlyphClassDefn *in_stack_fffffffffffffed8;
  GdlGlyphIntersectionClassDefn *in_stack_fffffffffffffee0;
  GrcSymbolTableEntry *this_01;
  long local_e8;
  GdlRenderer *pGVar1;
  string local_d0 [32];
  string local_b0 [32];
  Symbol local_90;
  string local_88 [32];
  GrpLineAndFile *in_stack_ffffffffffffff98;
  GrcSymbolTable *in_stack_ffffffffffffffa0;
  GdlRenderer *local_28;
  
  pGVar1 = in_RDX;
  if (in_RDX == (GdlRenderer *)0x0) {
    local_e8 = 0;
  }
  else {
    local_e8 = __dynamic_cast(in_RDX,&GdlGlyphClassDefn::typeinfo,
                              &GdlGlyphIntersectionClassDefn::typeinfo,0);
  }
  local_28 = in_RDX;
  if (local_e8 == 0) {
    local_28 = (GdlRenderer *)operator_new(0x140);
    GdlGlyphIntersectionClassDefn::GdlGlyphIntersectionClassDefn(in_stack_fffffffffffffee0);
    GdlObject::SetLineAndFile
              ((GdlObject *)in_stack_fffffffffffffee0,(GrpLineAndFile *)in_stack_fffffffffffffed8);
    this_01 = (GrcSymbolTableEntry *)&stack0xffffffffffffff98;
    GdlGlyphClassDefn::Name_abi_cxx11_(in_stack_fffffffffffffed8);
    std::__cxx11::string::string(local_88,(string *)this_01);
    GdlGlyphClassDefn::SetName
              (&in_stack_fffffffffffffee0->super_GdlGlyphClassDefn,
               (string *)in_stack_fffffffffffffed8);
    std::__cxx11::string::~string(local_88);
    pglfc_00 = (GdlGlyphClassDefn *)SymbolTable(in_RDI);
    this_00 = (GdlGlyphIntersectionClassDefn *)
              GdlObject::LineAndFile
                        (&(((GdlGlyphClassMember *)&in_RDX->super_GdlObject)->super_GdlDefn).
                          super_GdlObject);
    pglfd = GrcSymbolTable::AddAnonymousClassSymbol
                      (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_90 = pglfd;
    GrcSymbolTableEntry::FullName_abi_cxx11_((GrcSymbolTableEntry *)pGVar1);
    std::__cxx11::string::string(local_d0,local_b0);
    GdlGlyphClassDefn::SetName((GdlGlyphClassDefn *)in_RDX,(string *)in_stack_fffffffffffffed8);
    std::__cxx11::string::~string(local_d0);
    GrcSymbolTableEntry::ReplaceClassData(this_01,pglfc_00);
    GdlGlyphIntersectionClassDefn::AddSet
              (this_00,(GdlGlyphClassMember *)pglfd,(GrpLineAndFile *)in_RDX);
    GrcSymbolTableEntry::SetData(in_RSI,(GdlDefn *)local_28);
    GdlRenderer::AddGlyphClass(in_RDX,in_stack_fffffffffffffed8);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  }
  return (GdlGlyphClassDefn *)local_28;
}

Assistant:

GdlGlyphClassDefn * GrcManager::ConvertClassToIntersection(Symbol psymClass,
	GdlGlyphClassDefn * pglfc, GrpLineAndFile & lnf)
{
	GdlGlyphClassDefn * pglfcRet;

	GdlGlyphIntersectionClassDefn * pglfci
			= dynamic_cast<GdlGlyphIntersectionClassDefn *>(pglfc);
	if (pglfci)
	{
		// Already an intersection class.
		pglfcRet = pglfc;
	}
	else
	{
		GdlGlyphIntersectionClassDefn * pglfciNew = new GdlGlyphIntersectionClassDefn();
		pglfciNew->SetLineAndFile(lnf);
		std::string staName = pglfc->Name();
		pglfciNew->SetName(staName);

		Symbol psymAnonClass = SymbolTable()->AddAnonymousClassSymbol(pglfc->LineAndFile());
		std::string staAnonClassName = psymAnonClass->FullName();
		pglfc->SetName(staAnonClassName);
		psymAnonClass->ReplaceClassData(pglfc);

		// Make the original class one of the set elements of the intersection.
		pglfciNew->AddSet(pglfc, lnf);
		psymClass->SetData(pglfciNew);

		pglfcRet = dynamic_cast<GdlGlyphClassDefn *>(pglfciNew);
		m_prndr->AddGlyphClass(pglfcRet);
	}

	return pglfcRet;
}